

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

bool __thiscall Json::Value::operator==(Value *this,Value *other)

{
  ObjectValues *pOVar1;
  char *__s1;
  char *__s2;
  bool bVar2;
  int iVar3;
  char cVar4;
  
  cVar4 = (char)*(undefined2 *)&this->field_0x8;
  if (other->field_0x8 != cVar4) goto LAB_00591fac;
  bVar2 = true;
  switch(cVar4) {
  case '\0':
    break;
  case '\x01':
  case '\x02':
    bVar2 = (this->value_).int_ == (other->value_).int_;
    break;
  case '\x03':
    bVar2 = (bool)(-((other->value_).real_ == (this->value_).real_) & 1);
    break;
  case '\x04':
    __s1 = (this->value_).string_;
    __s2 = (other->value_).string_;
    if (__s1 == __s2) {
      return true;
    }
    if (__s1 != (char *)0x0 && __s2 != (char *)0x0) {
      iVar3 = strcmp(__s1,__s2);
      return iVar3 == 0;
    }
    goto LAB_00591fac;
  case '\x05':
    bVar2 = (this->value_).bool_ == (other->value_).bool_;
    break;
  case '\x06':
  case '\a':
    pOVar1 = (this->value_).map_;
    if ((pOVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count ==
        (((other->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
      bVar2 = std::__equal<false>::
              equal<std::_Rb_tree_const_iterator<std::pair<Json::Value::CZString_const,Json::Value>>,std::_Rb_tree_const_iterator<std::pair<Json::Value::CZString_const,Json::Value>>>
                        ((pOVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                         (_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>
                          )&(pOVar1->_M_t)._M_impl.super__Rb_tree_header,
                         (((other->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_header.
                         _M_left);
      return bVar2;
    }
LAB_00591fac:
    bVar2 = false;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                  ,0x207,"bool Json::Value::operator==(const Value &) const");
  }
  return bVar2;
}

Assistant:

bool Value::operator==(const Value& other) const {
  // if ( type_ != other.type_ )
  // GCC 2.95.3 says:
  // attempt to take address of bit-field structure member `Json::Value::type_'
  // Beats me, but a temp solves the problem.
  int temp = other.type_;
  if (type_ != temp)
    return false;
  switch (type_) {
  case nullValue:
    return true;
  case intValue:
    return value_.int_ == other.value_.int_;
  case uintValue:
    return value_.uint_ == other.value_.uint_;
  case realValue:
    return value_.real_ == other.value_.real_;
  case booleanValue:
    return value_.bool_ == other.value_.bool_;
  case stringValue:
    return (value_.string_ == other.value_.string_) ||
           (other.value_.string_ && value_.string_ &&
            strcmp(value_.string_, other.value_.string_) == 0);
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  case arrayValue:
  case objectValue:
    return value_.map_->size() == other.value_.map_->size() &&
           (*value_.map_) == (*other.value_.map_);
#else
  case arrayValue:
    return value_.array_->compare(*(other.value_.array_)) == 0;
  case objectValue:
    return value_.map_->compare(*(other.value_.map_)) == 0;
#endif
  default:
    JSON_ASSERT_UNREACHABLE;
  }
  return false; // unreachable
}